

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall
ExprConverterTest_ConvertLogicalCountToRelational_Test::
~ExprConverterTest_ConvertLogicalCountToRelational_Test
          (ExprConverterTest_ConvertLogicalCountToRelational_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExprConverterTest, ConvertLogicalCountToRelational) {
  mp::ExprFactory f;
  auto lhs = f.MakeNumericConstant(42);
  auto rhs = f.EndCount(f.BeginCount(0));
  MockConverter converter;
  auto e = f.MakeLogicalCount(expr::ATLEAST, lhs, rhs);
  EXPECT_CALL(converter, VisitLE(IsRelational(expr::LE, e)));
  converter.Visit(e);
  e = f.MakeLogicalCount(expr::ATMOST, lhs, rhs);
  EXPECT_CALL(converter, VisitGE(IsRelational(expr::GE, e)));
  converter.Visit(e);
  e = f.MakeLogicalCount(expr::EXACTLY, lhs, rhs);
  EXPECT_CALL(converter, VisitEQ(IsRelational(expr::EQ, e)));
  converter.Visit(e);
  e = f.MakeLogicalCount(expr::NOT_ATLEAST, lhs, rhs);
  EXPECT_CALL(converter, VisitGT(IsRelational(expr::GT, e)));
  converter.Visit(e);
  e = f.MakeLogicalCount(expr::NOT_ATMOST, lhs, rhs);
  EXPECT_CALL(converter, VisitLT(IsRelational(expr::LT, e)));
  converter.Visit(e);
  e = f.MakeLogicalCount(expr::NOT_EXACTLY, lhs, rhs);
  EXPECT_CALL(converter, VisitNE(IsRelational(expr::NE, e)));
  converter.Visit(e);
}